

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

Id __thiscall spv::Builder::getContainedTypeId(Builder *this,Id typeId,int member)

{
  Instruction *pIVar1;
  ulong uVar2;
  Id *pIVar3;
  
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[typeId];
  uVar2 = (ulong)pIVar1->opCode;
  if (uVar2 < 0x21) {
    if ((0x31800000UL >> (uVar2 & 0x3f) & 1) == 0) {
      if (uVar2 == 0x1e) {
        pIVar3 = (Id *)((long)member * 4 +
                       *(long *)&(pIVar1->operands).
                                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data);
        goto LAB_00197697;
      }
      if (uVar2 == 0x20) {
        pIVar3 = (Id *)(*(long *)&(pIVar1->operands).
                                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                  ._M_impl.super__Vector_impl_data + 4);
        goto LAB_00197697;
      }
      goto LAB_001976b0;
    }
  }
  else {
LAB_001976b0:
    if (pIVar1->opCode != OpTypeCooperativeMatrixKHR) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                    ,0x2ad,"Id spv::Builder::getContainedTypeId(Id, int) const");
    }
  }
  pIVar3 = (pIVar1->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
LAB_00197697:
  return *pIVar3;
}

Assistant:

Instruction* getInstruction(Id id) const { return idToInstruction[id]; }